

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O3

void __thiscall
kj::_::
Tuple<kj::Maybe<kj::Array<kj::String>>,kj::Array<capnp::Orphan<capnp::compiler::Statement>>,kj::Maybe<kj::Array<kj::String>>>
::
Tuple<kj::Maybe<kj::Array<kj::String>>,kj::Array<capnp::Orphan<capnp::compiler::Statement>>,kj::Maybe<kj::Array<kj::String>>>
          (Tuple<kj::Maybe<kj::Array<kj::String>>,kj::Array<capnp::Orphan<capnp::compiler::Statement>>,kj::Maybe<kj::Array<kj::String>>>
           *this,Maybe<kj::Array<kj::String>_> *params,
          Array<capnp::Orphan<capnp::compiler::Statement>_> *params_1,
          Maybe<kj::Array<kj::String>_> *params_2)

{
  Maybe<kj::Array<kj::String>_>::Maybe((Maybe<kj::Array<kj::String>_> *)this,params);
  *(Orphan<capnp::compiler::Statement> **)(this + 0x20) = params_1->ptr;
  *(size_t *)(this + 0x28) = params_1->size_;
  *(ArrayDisposer **)(this + 0x30) = params_1->disposer;
  params_1->ptr = (Orphan<capnp::compiler::Statement> *)0x0;
  params_1->size_ = 0;
  Maybe<kj::Array<kj::String>_>::Maybe((Maybe<kj::Array<kj::String>_> *)(this + 0x38),params_2);
  return;
}

Assistant:

constexpr Tuple(Params&&... params): impl(kj::fwd<Params>(params)...) {}